

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  char *pcVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  const_iterator cVar8;
  const_iterator cVar9;
  mapped_type *pmVar10;
  int *piVar11;
  ulong uVar12;
  undefined8 uVar13;
  long *plVar14;
  ulong uVar15;
  long lVar16;
  int i;
  ulong uVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [12];
  string message;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  GGWave ggWave;
  key_type local_670;
  uint local_650;
  long *local_648;
  _Base_ptr local_640;
  _Base_ptr local_638;
  _Base_ptr local_630;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_628 [8];
  _Rb_tree_node_base local_620;
  long local_5f8;
  char *local_5f0;
  key_type local_5e8 [45];
  
  printf("Usage: %s [-p] [-b] [-tN] [-lN]\n",*argv);
  puts("    -p  - print tones, no playback");
  puts("    -A  - print Arduino code");
  puts("    -b  - use \'beep\' command");
  puts("    -s  - use Direct Sequence Spread (DSS)");
  puts("    -tN - transmission protocol");
  printf("    -lN - fixed payload length of size N, N in [1, %d]\n",0x40);
  putchar(10);
  local_648 = (long *)GGWave::Protocols::tx();
  memcpy(local_648,&PTR_anon_var_dwarf_2843_00104c20,0x160);
  parseCmdArguments_abi_cxx11_((int)local_628,(char **)(ulong)(uint)argc);
  paVar1 = &local_5e8[0].field_2;
  local_5e8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"p","");
  local_638 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(local_628,local_5e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_5e8[0]._M_dataplus._M_p);
  }
  local_5e8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"A","");
  local_630 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(local_628,local_5e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_5e8[0]._M_dataplus._M_p);
  }
  local_5e8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"b","");
  local_640 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(local_628,local_5e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_5e8[0]._M_dataplus._M_p);
  }
  local_5e8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"s","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(local_628,local_5e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_5e8[0]._M_dataplus._M_p);
  }
  local_5e8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"t","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(local_628,local_5e8);
  uVar12 = 0;
  if (cVar9._M_node == &local_620) {
LAB_00102790:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8[0]._M_dataplus._M_p != &local_5e8[0].field_2) {
      operator_delete(local_5e8[0]._M_dataplus._M_p);
    }
    local_5e8[0]._M_dataplus._M_p = (pointer)&local_5e8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"l","");
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(local_628,local_5e8);
    uVar15 = 0x10;
    if (cVar9._M_node == &local_620) {
LAB_0010289d:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e8[0]._M_dataplus._M_p != &local_5e8[0].field_2) {
        operator_delete(local_5e8[0]._M_dataplus._M_p);
      }
      local_650 = (uint)(cVar8._M_node != &local_620) << 4 | 0xc;
      local_670._M_dataplus._M_p._4_4_ = 0x473b8000;
      local_670._M_string_length._0_4_ = 0x473b8000;
      local_670._M_string_length._4_4_ = 0x473b8000;
      local_670.field_2._M_allocated_capacity._0_4_ = 0x400;
      local_670.field_2._4_8_ = 0x540400000;
      local_670.field_2._12_4_ = 5;
      local_670._M_dataplus._M_p._0_4_ = (int)uVar15;
      GGWave::GGWave((GGWave *)local_5e8,(ggwave_Parameters *)&local_670);
      puts("Available Tx protocols:");
      uVar17 = 0;
      plVar14 = local_648;
      do {
        if ((*(char *)((long)plVar14 + 0xd) == '\x01') && (*plVar14 != 0)) {
          printf("    -t%-2d : %-16s\n",uVar17 & 0xffffffff);
        }
        uVar17 = uVar17 + 1;
        plVar14 = plVar14 + 2;
      } while (uVar17 != 0x16);
      putchar(10);
      if ((uint)uVar12 < 0x16) {
        printf("Selecting Tx protocol %d\n",uVar12 & 0xffffffff);
        iVar7 = 1;
        if ((((local_630 == &local_620) && (local_638 == &local_620)) && (local_640 == &local_620))
           && ((iVar6 = ioctl(1,0x4b30,0), iVar6 != 0 && (iVar7 = open("/dev/tty0",0), iVar7 < 0))))
        {
          main_cold_1();
          iVar7 = 1;
        }
        else {
          fwrite("Enter a text message:\n",0x16,1,_stderr);
          local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
          local_670._M_string_length._0_4_ = 0;
          local_670._M_string_length._4_4_ = 0;
          local_670.field_2._M_allocated_capacity._0_4_ =
               local_670.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
          cVar5 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '0');
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&std::cin,(string *)&local_670,cVar5);
          putchar(10);
          if ((char *)CONCAT44(local_670._M_string_length._4_4_,(int)local_670._M_string_length) ==
              (char *)0x0) {
            main_cold_2();
            iVar7 = -2;
          }
          else if ((int)uVar15 < (int)local_670._M_string_length) {
            fprintf(_stderr,"Invalid message: size > %d\n",uVar15 & 0xffffffff);
            iVar7 = -3;
          }
          else {
            GGWave::init((int)local_5e8,
                         (char *)CONCAT44(local_670._M_string_length._4_4_,
                                          (int)local_670._M_string_length),
                         (ggwave_ProtocolId)local_670._M_dataplus._M_p,(uint)uVar12);
            GGWave::encode();
            auVar20 = GGWave::txTones();
            local_5f8 = auVar20._0_8_;
            iVar6 = GGWave::samplesPerFrame();
            fVar18 = (float)GGWave::sampleRateOut();
            plVar14 = local_648;
            if (auVar20._8_4_ == 0) {
              iVar7 = 0;
            }
            else {
              cVar5 = *(char *)((long)local_648 + (uVar12 & 0xffffffff) * 0x10 + 10);
              lVar16 = 0;
              do {
                lVar4 = plVar14[(uVar12 & 0xffffffff) * 2 + 1];
                cVar2 = *(char *)(local_5f8 + lVar16);
                fVar19 = (float)GGWave::hzPerSample();
                processTone(iVar7,(double)(fVar19 * (float)((int)cVar2 + (int)(short)lVar4)),
                            (long)(int)((float)(int)cVar5 * (((float)iVar6 * 1000.0) / fVar18)),
                            local_640 != &local_620,local_638 != &local_620,local_630 != &local_620)
                ;
                lVar16 = lVar16 + 1;
              } while (auVar20._8_4_ != lVar16);
              iVar7 = 0;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_670._M_dataplus._M_p != &local_670.field_2) {
            operator_delete(local_670._M_dataplus._M_p);
          }
        }
      }
      else {
        fprintf(_stderr,"Unknown Tx protocol %d\n",uVar12 & 0xffffffff);
        iVar7 = -3;
      }
      GGWave::~GGWave((GGWave *)local_5e8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(local_628);
      return iVar7;
    }
    local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"l","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_628,&local_670);
    pcVar3 = (pmVar10->_M_dataplus)._M_p;
    piVar11 = __errno_location();
    iVar7 = *piVar11;
    *piVar11 = 0;
    uVar15 = strtol(pcVar3,&local_5f0,10);
    if (local_5f0 != pcVar3) {
      if (((long)(int)uVar15 == uVar15) && (*piVar11 != 0x22)) {
        if (*piVar11 == 0) {
          *piVar11 = iVar7;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_670._M_dataplus._M_p != &local_670.field_2) {
          operator_delete(local_670._M_dataplus._M_p);
        }
        goto LAB_0010289d;
      }
      goto LAB_00102c00;
    }
  }
  else {
    local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"t","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_628,&local_670);
    pcVar3 = (pmVar10->_M_dataplus)._M_p;
    piVar11 = __errno_location();
    iVar7 = *piVar11;
    *piVar11 = 0;
    uVar12 = strtol(pcVar3,&local_5f0,10);
    if (local_5f0 == pcVar3) {
      std::__throw_invalid_argument("stoi");
    }
    else if (((long)(int)uVar12 == uVar12) && (*piVar11 != 0x22)) {
      if (*piVar11 == 0) {
        *piVar11 = iVar7;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670._M_dataplus._M_p != &local_670.field_2) {
        operator_delete(local_670._M_dataplus._M_p);
      }
      goto LAB_00102790;
    }
    std::__throw_out_of_range("stoi");
  }
  std::__throw_invalid_argument("stoi");
LAB_00102c00:
  uVar13 = std::__throw_out_of_range("stoi");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != &local_670.field_2) {
    operator_delete(local_670._M_dataplus._M_p);
  }
  GGWave::~GGWave((GGWave *)local_5e8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_628);
  _Unwind_Resume(uVar13);
}

Assistant:

int main(int argc, char** argv) {
    printf("Usage: %s [-p] [-b] [-tN] [-lN]\n", argv[0]);
    printf("    -p  - print tones, no playback\n");
    printf("    -A  - print Arduino code\n");
    printf("    -b  - use 'beep' command\n");
    printf("    -s  - use Direct Sequence Spread (DSS)\n");
    printf("    -tN - transmission protocol\n");
    printf("    -lN - fixed payload length of size N, N in [1, %d]\n", GGWave::kMaxLengthFixed);
    printf("\n");

    auto & protocols = GGWave::Protocols::tx();
    protocols = { {
        { "[R2T2] Normal",      64,  9, 1, 2, true, },
        { "[R2T2] Fast",        64,  6, 1, 2, true, },
        { "[R2T2] Fastest",     64,  3, 1, 2, true, },
        { "[R2T2] Low Normal",  16,  9, 1, 2, true, },
        { "[R2T2] Low Fast",    16,  6, 1, 2, true, },
        { "[R2T2] Low Fastest", 16,  3, 1, 2, true, },
    } };

    const auto argm         = parseCmdArguments(argc, argv);
    const bool printTones   = argm.count("p") > 0;
    const bool printArduino = argm.count("A") > 0;
    const bool useBeep      = argm.count("b") > 0;
    const bool useDSS       = argm.count("s") > 0;
    const int txProtocolId  = argm.count("t") == 0 ? 0 : std::stoi(argm.at("t"));
    const int payloadLength = argm.count("l") == 0 ? 16 : std::stoi(argm.at("l"));

    GGWave::OperatingMode mode = GGWAVE_OPERATING_MODE_TX | GGWAVE_OPERATING_MODE_TX_ONLY_TONES;
    if (useDSS) mode |= GGWAVE_OPERATING_MODE_USE_DSS;

    GGWave ggWave({
        payloadLength,
        GGWave::kDefaultSampleRate,
        GGWave::kDefaultSampleRate,
        GGWave::kDefaultSampleRate,
        GGWave::kDefaultSamplesPerFrame,
        GGWave::kDefaultSoundMarkerThreshold,
        GGWAVE_SAMPLE_FORMAT_F32,
        GGWAVE_SAMPLE_FORMAT_F32,
        mode,
    });

    printf("Available Tx protocols:\n");
    for (int i = 0; i < (int) protocols.size(); ++i) {
        const auto & protocol = protocols[i];
        if (protocol.enabled && protocol.name) {
            printf("    -t%-2d : %-16s\n", i, protocol.name);
        }
    }
    printf("\n");

    if (txProtocolId < 0 || txProtocolId >= (int) protocols.size()) {
        fprintf(stderr, "Unknown Tx protocol %d\n", txProtocolId);
        return -3;
    }

    printf("Selecting Tx protocol %d\n", txProtocolId);

    int fd = 1;
    if (useBeep == false && printTones == false && printArduino == false) {
        if (ioctl(fd, KDMKTONE, 0)) {
            fd = open(CONSOLE, O_RDONLY);
        }
        if (fd < 0) {
            perror(CONSOLE);
            fprintf(stderr, "This program must be run as root\n");
            return 1;
        }
    }

    fprintf(stderr, "Enter a text message:\n");

    std::string message;
    std::getline(std::cin, message);

    printf("\n");

    if (message.size() == 0) {
        fprintf(stderr, "Invalid message: size = 0\n");
        return -2;
    }

    if ((int) message.size() > payloadLength) {
        fprintf(stderr, "Invalid message: size > %d\n", payloadLength);
        return -3;
    }

    ggWave.init(message.size(), message.data(), GGWave::TxProtocolId(txProtocolId), 10);
    ggWave.encode();

    const auto & protocol = protocols[txProtocolId];
    const auto tones = ggWave.txTones();
    const auto duration_ms = protocol.txDuration_ms(ggWave.samplesPerFrame(), ggWave.sampleRateOut());
    for (auto & tone : tones) {
        const auto freq_hz = (protocol.freqStart + tone)*ggWave.hzPerSample();
        processTone(fd, freq_hz, duration_ms, useBeep, printTones, printArduino);
    }

    return 0;
}